

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O1

void __thiscall cursespp::LayoutBase::SetFocusIndex(LayoutBase *this,int index,bool applyFocus)

{
  IDisplayable local_20;
  
  if ((this->focusable).
      super__Vector_base<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->focusable).
      super__Vector_base<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    IndexFocusables(this);
  }
  this->focused = index;
  if (applyFocus) {
    EnsureValidFocus((LayoutBase *)&stack0xffffffffffffffd8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._vptr_IDisplayable !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._vptr_IDisplayable);
    }
  }
  return;
}

Assistant:

void LayoutBase::SetFocusIndex(int index, bool applyFocus) {
    if (!this->focusable.size()) {
        this->IndexFocusables();
    }
    this->focused = index;
    if (applyFocus) {
        this->EnsureValidFocus();
    }
}